

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_layer_t.h
# Opt level: O0

void __thiscall
conv_layer_t::conv_layer_t
          (conv_layer_t *this,uint16_t stride,uint16_t extend_filter,uint16_t number_filters,
          tdsize in_size)

{
  int iVar1;
  ushort in_CX;
  ushort in_DX;
  ushort in_SI;
  tensor_t<float> *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  float fVar2;
  tensor_t<gradient_t> t_1;
  int i_1;
  int z;
  int j;
  int i;
  int maxval;
  tensor_t<float> t;
  int a;
  float fVar3;
  tensor_t<float> *in_stack_fffffffffffffeb0;
  value_type *__x;
  int *this_00;
  tensor_t<float> *in_stack_fffffffffffffed8;
  tensor_t<float> *in_stack_fffffffffffffee0;
  layer_type in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_bc;
  int local_10;
  int iStack_c;
  
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  iStack_c = (int)((ulong)in_R8 >> 0x20);
  tensor_t<float>::tensor_t
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  layer_t::layer_t((layer_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_RDI);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x102d1b);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x102d28);
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x102d35);
  __x = (value_type *)
        ((long)&in_RDI[3].data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 4);
  std::vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_>::vector
            ((vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_> *)0x102d48);
  this_00 = &in_RDI[3].size.y;
  std::vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>::vector
            ((vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_> *)0x102d5e);
  *(ushort *)
   ((long)&in_RDI[4].data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = in_SI;
  *(ushort *)
   ((long)&in_RDI[4].data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish + 6) = in_DX;
  local_10 = (int)in_R8;
  fVar3 = (float)(int)(local_10 - (uint)in_DX) / (float)in_SI + 1.0;
  fVar2 = (float)((int)(local_10 - (uint)in_DX) / (int)(uint)in_SI + 1);
  if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
    __assert_fail("(float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/conv_layer_t.h"
                  ,0x21,"conv_layer_t::conv_layer_t(uint16_t, uint16_t, uint16_t, tdsize)");
  }
  fVar3 = (float)(int)(iStack_c - (uint)in_DX) / (float)in_SI + 1.0;
  fVar2 = (float)((int)(iStack_c - (uint)in_DX) / (int)(uint)in_SI + 1);
  if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
    for (local_bc = 0; local_bc < (int)(uint)in_CX; local_bc = local_bc + 1) {
      tensor_t<float>::tensor_t
                ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      for (local_f0 = 0; local_f0 < (int)(uint)in_DX; local_f0 = local_f0 + 1) {
        for (local_f4 = 0; local_f4 < (int)(uint)in_DX; local_f4 = local_f4 + 1) {
          for (local_f8 = 0; local_f8 < in_R9D; local_f8 = local_f8 + 1) {
            fVar2 = 1.0 / (float)(int)((uint)in_DX * (uint)in_DX * in_R9D);
            iVar1 = rand();
            fVar3 = fVar2 * (float)iVar1 * 4.656613e-10;
            in_stack_fffffffffffffeb0 =
                 (tensor_t<float> *)
                 tensor_t<float>::operator()(in_stack_fffffffffffffeb0,(int)fVar3,(int)fVar2,0);
            *(float *)&(in_stack_fffffffffffffeb0->data).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start = fVar3;
          }
        }
      }
      std::vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_>::push_back
                ((vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_> *)this_00,__x);
      tensor_t<float>::~tensor_t((tensor_t<float> *)0x10308f);
    }
    for (iVar1 = 0; iVar1 < (int)(uint)in_CX; iVar1 = iVar1 + 1) {
      tensor_t<gradient_t>::tensor_t
                ((tensor_t<gradient_t> *)CONCAT44(iVar1,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      std::vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>::push_back
                ((vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_> *)this_00,
                 (value_type *)__x);
      tensor_t<gradient_t>::~tensor_t((tensor_t<gradient_t> *)0x1030fc);
    }
    return;
  }
  __assert_fail("(float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/conv_layer_t.h"
                ,0x22,"conv_layer_t::conv_layer_t(uint16_t, uint16_t, uint16_t, tdsize)");
}

Assistant:

conv_layer_t(uint16_t stride, uint16_t extend_filter, uint16_t number_filters, tdsize in_size) :
      layer_t(layer_type::conv,
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(in_size.x, in_size.y, in_size.z),
              tensor_t<float>(
                  (in_size.x - extend_filter) / stride + 1,
                  (in_size.y - extend_filter) / stride + 1,
                  number_filters)
      ), stride(stride), extend_filter(extend_filter) {
    assert((float(in_size.x - extend_filter) / stride + 1) == ((in_size.x - extend_filter) / stride + 1));
    assert((float(in_size.y - extend_filter) / stride + 1) == ((in_size.y - extend_filter) / stride + 1));

    for (int a = 0; a < number_filters; a++) {
      tensor_t<float> t(extend_filter, extend_filter, in_size.z);

      int maxval = extend_filter * extend_filter * in_size.z;

      for (int i = 0; i < extend_filter; i++)
        for (int j = 0; j < extend_filter; j++)
          for (int z = 0; z < in_size.z; z++)
            t(i, j, z) = 1.0f / maxval * rand() / float(RAND_MAX);
      filters.push_back(t);
    }
    for (int i = 0; i < number_filters; i++) {
      tensor_t<gradient_t> t(extend_filter, extend_filter, in_size.z);
      filter_grads.push_back(t);
    }

  }